

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O2

subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
* __thiscall
burst::make_subsequence_iterator<std::__cxx11::list<int,std::allocator<int>>const&>
          (subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
           *__return_storage_ptr__,burst *this,list<int,_std::allocator<int>_> *range)

{
  subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
  ::subsequence_iterator
            (__return_storage_ptr__,*(_List_node_base **)this,(_List_const_iterator<int>)this);
  return __return_storage_ptr__;
}

Assistant:

auto make_subsequence_iterator (ForwardRange && range)
    {
        using std::begin;
        using std::end;
        return
            make_subsequence_iterator
            (
                begin(std::forward<ForwardRange>(range)),
                end(std::forward<ForwardRange>(range))
            );
    }